

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O2

void __thiscall TEST_SimpleString_Binary_Test::testBody(TEST_SimpleString_Binary_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  SimpleString local_40;
  uchar value [4];
  char expectedString [12];
  
  value[0] = '\0';
  value[1] = '\x01';
  value[2] = '*';
  value[3] = 0xff;
  builtin_strncpy(expectedString,"00 01 2A FF",0xc);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinary((uchar *)&local_40,(size_t)value);
  pcVar2 = SimpleString::asCharString(&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,expectedString,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x43f,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinaryOrNull((uchar *)&local_40,(size_t)value);
  pcVar2 = SimpleString::asCharString(&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,expectedString,pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x440,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinary((uchar *)&local_40,(size_t)value);
  pcVar2 = SimpleString::asCharString(&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x441,pTVar3);
  SimpleString::~SimpleString(&local_40);
  pUVar1 = UtestShell::getCurrent();
  StringFromBinaryOrNull((uchar *)&local_40,0);
  pcVar2 = SimpleString::asCharString(&local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,"(null)",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
             ,0x442,pTVar3);
  SimpleString::~SimpleString(&local_40);
  return;
}

Assistant:

TEST(SimpleString, Binary)
{
    const unsigned char value[] = { 0x00, 0x01, 0x2A, 0xFF };
    const char expectedString[] = "00 01 2A FF";

    STRCMP_EQUAL(expectedString, StringFromBinary(value, sizeof(value)).asCharString());
    STRCMP_EQUAL(expectedString, StringFromBinaryOrNull(value, sizeof(value)).asCharString());
    STRCMP_EQUAL("", StringFromBinary(value, 0).asCharString());
    STRCMP_EQUAL("(null)", StringFromBinaryOrNull(NULLPTR, 0).asCharString());
}